

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateFunctionMapFactory.cpp
# Opt level: O1

ElementFunctionMap *
COLLADASaxFWL14::FunctionMapFactory::createFunctionMap__asset__allChildren(void)

{
  mapped_type *pmVar1;
  
  if (createFunctionMap__asset__allChildren()::functionMap == '\0') {
    createFunctionMap__asset__allChildren();
  }
  if (createFunctionMap__asset__allChildren()::mapFilled == '\0') {
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_COLLADA)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__COLLADA;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__COLLADA;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__COLLADA;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__COLLADA;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__COLLADA;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__COLLADA;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLES__TECHNIQUE__PASS__ALPHA_FUNC);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__profile_GLES__technique__pass__alpha_func;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__profile_GLES__technique__pass__alpha_func;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__profile_GLES__technique__pass__alpha_func;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__alpha_func;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__profile_GLES__technique__pass__alpha_func;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__profile_GLES__technique__pass__alpha_func;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_AMBIENT____COMMON_COLOR_OR_TEXTURE_TYPE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__ambient____common_color_or_texture_type;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__ambient____common_color_or_texture_type;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__ambient____common_color_or_texture_type;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__ambient____common_color_or_texture_type;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__ambient____common_color_or_texture_type;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__ambient____common_color_or_texture_type;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_ANIMATION);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__animation;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__animation;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__animation;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__animation;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__animation;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__animation;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_ANIMATION_CLIP);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__animation_clip;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__animation_clip;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__animation_clip
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__animation_clip;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__animation_clip;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__animation_clip;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_ARRAY____GLSL_NEWARRAY_TYPE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__array____glsl_newarray_type
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__array____glsl_newarray_type;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__array____glsl_newarray_type;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__array____glsl_newarray_type;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__array____glsl_newarray_type;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__array____glsl_newarray_type;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_ATTACHMENT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__attachment;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__attachment
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__attachment;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__attachment;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__attachment;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__attachment;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLSL__TECHNIQUE__PASS__SHADER__BIND);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__profile_GLSL__technique__pass__shader__bind;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__profile_GLSL__technique__pass__shader__bind;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__profile_GLSL__technique__pass__shader__bind;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__shader__bind;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass__shader__bind;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL__technique__pass__shader__bind
    ;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_BIND_MATERIAL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__bind_material;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__bind_material;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__bind_material;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__bind_material;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__bind_material;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__bind_material;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_BLINN);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__blinn;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__blinn;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__blinn;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__blinn;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__blinn;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__blinn;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_BOX);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__box;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__box;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__box;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__box;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__box;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__box;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_CAMERA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__camera;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__camera;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__camera;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__camera;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__camera;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__camera;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_CAPSULE)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__capsule;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__capsule;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__capsule;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__capsule;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__capsule;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__capsule;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_COMMON__TECHNIQUE__CONSTANT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__profile_COMMON__technique__constant;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__profile_COMMON__technique__constant;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__profile_COMMON__technique__constant;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__profile_COMMON__technique__constant;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__profile_COMMON__technique__constant;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__profile_COMMON__technique__constant;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_CONTROL_VERTICES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__control_vertices;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__control_vertices;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__control_vertices;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__control_vertices
    ;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__control_vertices;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__control_vertices
    ;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_CONTROLLER);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__controller;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__controller
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__controller;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__controller;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__controller;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__controller;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_CONVEX_MESH);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__convex_mesh;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__convex_mesh;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__convex_mesh;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__convex_mesh;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__convex_mesh;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__convex_mesh;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_CYLINDER
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__cylinder
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__cylinder;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__cylinder;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__cylinder;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__cylinder;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__cylinder;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_DIFFUSE)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__diffuse;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__diffuse;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__diffuse;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__diffuse;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__diffuse;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__diffuse;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_EFFECT);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__effect;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__effect;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__effect;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__effect;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__effect;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__effect;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_EMISSION
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__emission
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__emission;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__emission;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__emission;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__emission;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__emission;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_EVALUATE_SCENE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__evaluate_scene;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__evaluate_scene;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__evaluate_scene
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__evaluate_scene;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__evaluate_scene;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__evaluate_scene;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_EXTRA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__extra;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__extra;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__extra;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__extra;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__extra;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_FORCE_FIELD);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__force_field;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__force_field;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__force_field;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__force_field;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__force_field;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__force_field;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_FORMAT_HINT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__format_hint;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__format_hint;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__format_hint;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__format_hint;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__format_hint;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__format_hint;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_GLSL_SURFACE_TYPE____GENERATOR);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__glsl_surface_type____generator;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__glsl_surface_type____generator;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__glsl_surface_type____generator;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__glsl_surface_type____generator;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__glsl_surface_type____generator;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__glsl_surface_type____generator;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_GEOMETRY
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__geometry
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__geometry;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__geometry;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__geometry;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__geometry;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__geometry;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_IMAGE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__image;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__image;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__image;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__image;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__image;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__image;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_IMAGER);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__imager;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__imager;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__imager;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__imager;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__imager;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__imager;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_ANIMATION);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_animation;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_animation;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_animation;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_animation;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_animation;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_animation;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_CAMERA);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_camera;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_camera;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_camera;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__instance_camera;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_camera;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__instance_camera;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_CONTROLLER);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_controller;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_controller;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_controller;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_controller;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_controller;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_controller;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_EFFECT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_effect;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_effect;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_effect;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__instance_effect;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_effect;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__instance_effect;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_FORCE_FIELD);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_force_field;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_force_field;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_force_field;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_force_field;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_force_field
    ;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_force_field;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_GEOMETRY);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_geometry;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_geometry;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_geometry;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_geometry;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_geometry;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_geometry;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_LIGHT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_light;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_light;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_light
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__instance_light;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_light;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__instance_light;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_MATERIAL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_material;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_material;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_material;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_material;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_material;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_material;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_NODE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_node;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_node;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_node;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__instance_node;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_node;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__instance_node;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_PHYSICS_MATERIAL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_physics_material;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_physics_material;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_physics_material;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_physics_material;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_physics_material;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_physics_material;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_PHYSICS_MODEL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_physics_model;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_physics_model;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_physics_model;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_physics_model;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_physics_model;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_physics_model;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_PHYSICS_SCENE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_physics_scene;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_physics_scene;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_physics_scene;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_physics_scene;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_physics_scene;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_physics_scene;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_rigid_body;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_rigid_body;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_rigid_body;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_rigid_body;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_CONSTRAINT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_VISUAL_SCENE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_visual_scene;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_visual_scene;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_visual_scene;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_visual_scene;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_visual_scene;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_visual_scene;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_JOINTS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__joints;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__joints;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__joints;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__joints;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__joints;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__joints;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_LAMBERT)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__lambert;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__lambert;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__lambert;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__lambert;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__lambert;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__lambert;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_ANIMATION_CLIPS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_ANIMATIONS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_animations;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_animations;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_animations;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_animations;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_animations;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_animations;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_CAMERAS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_cameras;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_cameras;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_cameras;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_cameras;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_cameras;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_cameras;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_CONTROLLERS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_controllers;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_controllers;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_controllers;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_controllers;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_controllers;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_controllers;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_EFFECTS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_effects;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_effects;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_effects;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_effects;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_effects;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_effects;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_FORCE_FIELDS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_force_fields
    ;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_GEOMETRIES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_geometries;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_geometries;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_geometries;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_geometries;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_geometries;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_geometries;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_IMAGES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_images;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_images;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_images
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_images;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_images;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_images;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_LIGHTS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_lights;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_lights;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_lights
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_lights;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_lights;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_lights;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_MATERIALS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_materials;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_materials;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_materials;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_materials;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_materials;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_materials;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_NODES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_nodes;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_nodes;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_nodes;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_nodes;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_nodes;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_nodes;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_MATERIALS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_MODELS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_SCENES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_VISUAL_SCENES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_LIGHT);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__light;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__light;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__light;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__light;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__light;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__light;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_LINES);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__lines;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__lines;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__lines;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__lines;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__lines;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__lines;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_LINESTRIPS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__linestrips;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__linestrips
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__linestrips;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__linestrips;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__linestrips;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__linestrips;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_MATERIAL
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__material
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__material;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__material;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__material;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__material;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__material;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_MESH);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__mesh;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__mesh;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__mesh;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__mesh;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__mesh;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__mesh;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_MORPH);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__morph;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__morph;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__morph;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__morph;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__morph;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__morph;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_NEWPARAM____FX_NEWPARAM_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__newparam____fx_newparam_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__newparam____fx_newparam_common;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__newparam____fx_newparam_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__newparam____fx_newparam_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__newparam____fx_newparam_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__newparam____fx_newparam_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_NODE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__node;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__node;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__node;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__node;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__node;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__node;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_OPTICS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__optics;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__optics;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__optics;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__optics;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__optics;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__optics;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLSL__TECHNIQUE__PASS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__profile_GLSL__technique__pass;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__profile_GLSL__technique__pass;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__profile_GLSL__technique__pass;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL__technique__pass;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_PHONG);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__phong;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__phong;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__phong;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__phong;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__phong;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__phong;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PHYSICS_MATERIAL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__physics_material;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__physics_material;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__physics_material;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__physics_material
    ;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__physics_material;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__physics_material
    ;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PHYSICS_MODEL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__physics_model;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__physics_model;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__physics_model;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__physics_model;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__physics_model;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__physics_model;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PHYSICS_SCENE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__physics_scene;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__physics_scene;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__physics_scene;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__physics_scene;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__physics_scene;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__physics_scene;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_PLANE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__plane;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__plane;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__plane;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__plane;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__plane;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__plane;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_POLYGONS
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__polygons
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__polygons;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__polygons;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__polygons;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__polygons;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__polygons;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_POLYLIST
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__polylist
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__polylist;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__polylist;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__polylist;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__polylist;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__polylist;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_CG);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__profile_CG;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__profile_CG
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__profile_CG;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__profile_CG;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__profile_CG;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__profile_CG;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__profile_COMMON;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__profile_COMMON;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__profile_COMMON
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__profile_COMMON;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__profile_COMMON;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__profile_COMMON;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__profile_GLES;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__profile_GLES;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__profile_GLES;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__profile_GLES;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__profile_GLES;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__profile_GLES;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLSL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__profile_GLSL;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__profile_GLSL;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__profile_GLSL;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__profile_GLSL;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__profile_GLSL;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_REF_ATTACHMENT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__ref_attachment;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__ref_attachment;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__ref_attachment
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__ref_attachment;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__ref_attachment;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__ref_attachment;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_REFLECTIVE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__reflective;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__reflective
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__reflective;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__reflective;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__reflective;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__reflective;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_RENDER);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__render;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__render;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__render;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__render;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__render;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__render;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_BODY);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__rigid_body;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__rigid_body
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__rigid_body;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__rigid_body;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__rigid_body;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__rigid_body;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_CONSTRAINT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__rigid_constraint
    ;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__rigid_constraint;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint
    ;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLER1D____FX_SAMPLER1D_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__sampler1D____fx_sampler1D_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__sampler1D____fx_sampler1D_common
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__sampler1D____fx_sampler1D_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__sampler1D____fx_sampler1D_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__sampler1D____fx_sampler1D_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__sampler1D____fx_sampler1D_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLER2D____FX_SAMPLER2D_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__sampler2D____fx_sampler2D_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__sampler2D____fx_sampler2D_common
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__sampler2D____fx_sampler2D_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__sampler2D____fx_sampler2D_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__sampler2D____fx_sampler2D_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__sampler2D____fx_sampler2D_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLER3D____FX_SAMPLER3D_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__sampler3D____fx_sampler3D_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__sampler3D____fx_sampler3D_common
    ;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__sampler3D____fx_sampler3D_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__sampler3D____fx_sampler3D_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__sampler3D____fx_sampler3D_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__sampler3D____fx_sampler3D_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLERCUBE____FX_SAMPLERCUBE_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__samplerCUBE____fx_samplerCUBE_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__samplerCUBE____fx_samplerCUBE_common;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__samplerCUBE____fx_samplerCUBE_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__samplerCUBE____fx_samplerCUBE_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__samplerCUBE____fx_samplerCUBE_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__samplerCUBE____fx_samplerCUBE_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLERDEPTH____FX_SAMPLERDEPTH_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__samplerDEPTH____fx_samplerDEPTH_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__samplerDEPTH____fx_samplerDEPTH_common;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__samplerDEPTH____fx_samplerDEPTH_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__samplerDEPTH____fx_samplerDEPTH_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__samplerDEPTH____fx_samplerDEPTH_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__samplerDEPTH____fx_samplerDEPTH_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLERRECT____FX_SAMPLERRECT_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__samplerRECT____fx_samplerRECT_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__samplerRECT____fx_samplerRECT_common;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__samplerRECT____fx_samplerRECT_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__samplerRECT____fx_samplerRECT_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__samplerRECT____fx_samplerRECT_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__samplerRECT____fx_samplerRECT_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLER_STATE____GLES_SAMPLER_STATE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__sampler_state____gles_sampler_state;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__sampler_state____gles_sampler_state;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__sampler_state____gles_sampler_state;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__sampler_state____gles_sampler_state;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__sampler_state____gles_sampler_state;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__sampler_state____gles_sampler_state;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_SCENE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__scene;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__scene;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__scene;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__scene;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__scene;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__scene;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_EFFECT__SETPARAM);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_effect__setparam;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_effect__setparam;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_effect__setparam;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_effect__setparam;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_effect__setparam;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_effect__setparam;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLSL__TECHNIQUE__PASS__SHADER);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__profile_GLSL__technique__pass__shader;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__profile_GLSL__technique__pass__shader;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__profile_GLSL__technique__pass__shader;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__shader;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass__shader;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL__technique__pass__shader;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::
         _freeAttributes__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_SKIN);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__skin;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__skin;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__skin;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__skin;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__skin;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__skin;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_SOURCE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__source;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__source;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__source;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__source;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__source;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__source;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_SPECULAR
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__specular
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__specular;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__specular;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__specular;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__specular;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__specular;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_SPHERE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__sphere;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__sphere;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__sphere;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__sphere;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__sphere;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__sphere;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_SPLINE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__spline;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__spline;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__spline;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__spline;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__spline;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__spline;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SURFACE____FX_SURFACE_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__surface____fx_surface_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__surface____fx_surface_common;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__surface____fx_surface_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__surface____fx_surface_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__surface____fx_surface_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__surface____fx_surface_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TAPERED_CAPSULE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__tapered_capsule;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__tapered_capsule;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__tapered_capsule;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__tapered_capsule;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__tapered_capsule;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__tapered_capsule;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TAPERED_CYLINDER);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__tapered_cylinder;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__tapered_cylinder;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__tapered_cylinder;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__tapered_cylinder
    ;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__tapered_cylinder;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__tapered_cylinder
    ;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_TARGETS)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__targets;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__targets;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__targets;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__targets;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__targets;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__targets;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLES__TECHNIQUE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__profile_GLES__technique;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__profile_GLES__technique;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__profile_GLES__technique;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__profile_GLES__technique;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__profile_GLES__technique;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXCOMBINER);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__texcombiner;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__texcombiner;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__texcombiner;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__texcombiner;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__texcombiner;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__texcombiner;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_TEXENV);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__texenv;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__texenv;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__texenv;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__texenv;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__texenv;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__texenv;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_TEXTURE)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__texture;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__texture;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__texture;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__texture;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__texture;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__texture;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXTURE1D);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__texture1D;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__texture1D;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__texture1D;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__texture1D;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__texture1D;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__texture1D;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXTURE2D);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__texture2D;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__texture2D;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__texture2D;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__texture2D;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__texture2D;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__texture2D;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXTURE3D);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__texture3D;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__texture3D;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__texture3D;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__texture3D;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__texture3D;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__texture3D;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXTURECUBE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__textureCUBE;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__textureCUBE;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__textureCUBE;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__textureCUBE;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__textureCUBE;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__textureCUBE;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXTUREDEPTH);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__textureDEPTH;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__textureDEPTH;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__textureDEPTH;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__textureDEPTH;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__textureDEPTH;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__textureDEPTH;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXTURERECT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__textureRECT;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__textureRECT;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__textureRECT;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__textureRECT;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__textureRECT;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__textureRECT;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_PROFILE_GLES__TECHNIQUE__PASS__TEXTURE_PIPELINE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__profile_GLES__technique__pass__texture_pipeline;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__profile_GLES__technique__pass__texture_pipeline;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__profile_GLES__technique__pass__texture_pipeline;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__texture_pipeline;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__profile_GLES__technique__pass__texture_pipeline;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::
         _freeAttributes__profile_GLES__technique__pass__texture_pipeline;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TEXTURE_UNIT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__texture_unit;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__texture_unit;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__texture_unit;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__texture_unit;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__texture_unit;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__texture_unit;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TRANSPARENT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__transparent;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__transparent;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__transparent;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__transparent;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__transparent;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__transparent;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TRIANGLES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__triangles;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__triangles;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__triangles;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__triangles;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__triangles;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__triangles;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_TRIFANS)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__trifans;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__trifans;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__trifans;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__trifans;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__trifans;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__trifans;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_TRISTRIPS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__tristrips;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__tristrips;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__tristrips;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__tristrips;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__tristrips;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__tristrips;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_USERTYPE
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__usertype
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__usertype;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__usertype;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__usertype;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__usertype;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__usertype;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_VALUE____GL_SAMPLER1D);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__value____gl_sampler1D;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__value____gl_sampler1D;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__value____gl_sampler1D;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__value____gl_sampler1D;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__value____gl_sampler1D;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__value____gl_sampler1D;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_VERTEX_WEIGHTS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__vertex_weights;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__vertex_weights;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__vertex_weights
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__vertex_weights;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__vertex_weights;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__vertex_weights;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_VERTICES
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__vertices
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__vertices;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__vertices;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__vertices;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__vertices;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__vertices;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_VISUAL_SCENE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__visual_scene;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__visual_scene;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__visual_scene;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__visual_scene;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__visual_scene;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__visual_scene;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_ASSET);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__asset;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__asset;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__asset;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__asset;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__asset;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_CONTRIBUTOR);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__contributor;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__contributor;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__contributor;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__contributor;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__contributor;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__contributor;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_CREATED)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__created;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__created;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__created;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__created;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__created;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__created;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_KEYWORDS
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__keywords;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__keywords;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__keywords;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__keywords;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_MODIFIED
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__modified
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__modified;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__modified;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__modified;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__modified;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_REVISION
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__revision
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__revision;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__revision;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__revision;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__revision;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_SUBJECT)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__subject;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__subject;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__subject;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__subject;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__subject;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_TITLE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__title;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__title;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__title;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__title;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__title;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__title;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_UNIT);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__unit;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__unit;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__unit;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__unit;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__unit;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_UP_AXIS)
    ;
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__up_axis;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__up_axis;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__up_axis;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_AUTHOR);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__author;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__author;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__author;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__author;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__author;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__author;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHORING_TOOL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__authoring_tool
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,&HASH_ELEMENT_COMMENTS
                         );
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__comments
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__comments;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__comments;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__comments;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__comments;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__comments;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_COPYRIGHT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__copyright;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__copyright;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__copyright;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__copyright;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__copyright;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__copyright;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__asset__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE_DATA);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__source_data;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__source_data;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__source_data;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__source_data;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__source_data;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__source_data;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    createFunctionMap__asset__allChildren()::mapFilled = '\x01';
  }
  return &createFunctionMap__asset__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen14Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__asset__allChildren() {
static ColladaParserAutoGen14Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__COLLADA, &ColladaParserAutoGen14Private::_data__COLLADA, &ColladaParserAutoGen14Private::_end__COLLADA, &ColladaParserAutoGen14Private::_preBegin__COLLADA, &ColladaParserAutoGen14Private::_preEnd__COLLADA, &ColladaParserAutoGen14Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_PROFILE_GLES__TECHNIQUE__PASS__ALPHA_FUNC] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLES__technique__pass__alpha_func, &ColladaParserAutoGen14Private::_data__profile_GLES__technique__pass__alpha_func, &ColladaParserAutoGen14Private::_end__profile_GLES__technique__pass__alpha_func, &ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__alpha_func, &ColladaParserAutoGen14Private::_preEnd__profile_GLES__technique__pass__alpha_func, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLES__technique__pass__alpha_func);
functionMap[HASH_ELEMENT_AMBIENT____COMMON_COLOR_OR_TEXTURE_TYPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__ambient____common_color_or_texture_type, &ColladaParserAutoGen14Private::_data__ambient____common_color_or_texture_type, &ColladaParserAutoGen14Private::_end__ambient____common_color_or_texture_type, &ColladaParserAutoGen14Private::_preBegin__ambient____common_color_or_texture_type, &ColladaParserAutoGen14Private::_preEnd__ambient____common_color_or_texture_type, &ColladaParserAutoGen14Private::_freeAttributes__ambient____common_color_or_texture_type);
functionMap[HASH_ELEMENT_ANIMATION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__animation, &ColladaParserAutoGen14Private::_data__animation, &ColladaParserAutoGen14Private::_end__animation, &ColladaParserAutoGen14Private::_preBegin__animation, &ColladaParserAutoGen14Private::_preEnd__animation, &ColladaParserAutoGen14Private::_freeAttributes__animation);
functionMap[HASH_ELEMENT_ANIMATION_CLIP] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__animation_clip, &ColladaParserAutoGen14Private::_data__animation_clip, &ColladaParserAutoGen14Private::_end__animation_clip, &ColladaParserAutoGen14Private::_preBegin__animation_clip, &ColladaParserAutoGen14Private::_preEnd__animation_clip, &ColladaParserAutoGen14Private::_freeAttributes__animation_clip);
functionMap[HASH_ELEMENT_ARRAY____GLSL_NEWARRAY_TYPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__array____glsl_newarray_type, &ColladaParserAutoGen14Private::_data__array____glsl_newarray_type, &ColladaParserAutoGen14Private::_end__array____glsl_newarray_type, &ColladaParserAutoGen14Private::_preBegin__array____glsl_newarray_type, &ColladaParserAutoGen14Private::_preEnd__array____glsl_newarray_type, &ColladaParserAutoGen14Private::_freeAttributes__array____glsl_newarray_type);
functionMap[HASH_ELEMENT_ATTACHMENT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__attachment, &ColladaParserAutoGen14Private::_data__attachment, &ColladaParserAutoGen14Private::_end__attachment, &ColladaParserAutoGen14Private::_preBegin__attachment, &ColladaParserAutoGen14Private::_preEnd__attachment, &ColladaParserAutoGen14Private::_freeAttributes__attachment);
functionMap[HASH_ELEMENT_PROFILE_GLSL__TECHNIQUE__PASS__SHADER__BIND] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLSL__technique__pass__shader__bind, &ColladaParserAutoGen14Private::_data__profile_GLSL__technique__pass__shader__bind, &ColladaParserAutoGen14Private::_end__profile_GLSL__technique__pass__shader__bind, &ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__shader__bind, &ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass__shader__bind, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL__technique__pass__shader__bind);
functionMap[HASH_ELEMENT_BIND_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_material, &ColladaParserAutoGen14Private::_data__bind_material, &ColladaParserAutoGen14Private::_end__bind_material, &ColladaParserAutoGen14Private::_preBegin__bind_material, &ColladaParserAutoGen14Private::_preEnd__bind_material, &ColladaParserAutoGen14Private::_freeAttributes__bind_material);
functionMap[HASH_ELEMENT_BLINN] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__blinn, &ColladaParserAutoGen14Private::_data__blinn, &ColladaParserAutoGen14Private::_end__blinn, &ColladaParserAutoGen14Private::_preBegin__blinn, &ColladaParserAutoGen14Private::_preEnd__blinn, &ColladaParserAutoGen14Private::_freeAttributes__blinn);
functionMap[HASH_ELEMENT_BOX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__box, &ColladaParserAutoGen14Private::_data__box, &ColladaParserAutoGen14Private::_end__box, &ColladaParserAutoGen14Private::_preBegin__box, &ColladaParserAutoGen14Private::_preEnd__box, &ColladaParserAutoGen14Private::_freeAttributes__box);
functionMap[HASH_ELEMENT_CAMERA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__camera, &ColladaParserAutoGen14Private::_data__camera, &ColladaParserAutoGen14Private::_end__camera, &ColladaParserAutoGen14Private::_preBegin__camera, &ColladaParserAutoGen14Private::_preEnd__camera, &ColladaParserAutoGen14Private::_freeAttributes__camera);
functionMap[HASH_ELEMENT_CAPSULE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__capsule, &ColladaParserAutoGen14Private::_data__capsule, &ColladaParserAutoGen14Private::_end__capsule, &ColladaParserAutoGen14Private::_preBegin__capsule, &ColladaParserAutoGen14Private::_preEnd__capsule, &ColladaParserAutoGen14Private::_freeAttributes__capsule);
functionMap[HASH_ELEMENT_PROFILE_COMMON__TECHNIQUE__CONSTANT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_COMMON__technique__constant, &ColladaParserAutoGen14Private::_data__profile_COMMON__technique__constant, &ColladaParserAutoGen14Private::_end__profile_COMMON__technique__constant, &ColladaParserAutoGen14Private::_preBegin__profile_COMMON__technique__constant, &ColladaParserAutoGen14Private::_preEnd__profile_COMMON__technique__constant, &ColladaParserAutoGen14Private::_freeAttributes__profile_COMMON__technique__constant);
functionMap[HASH_ELEMENT_CONTROL_VERTICES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__control_vertices, &ColladaParserAutoGen14Private::_data__control_vertices, &ColladaParserAutoGen14Private::_end__control_vertices, &ColladaParserAutoGen14Private::_preBegin__control_vertices, &ColladaParserAutoGen14Private::_preEnd__control_vertices, &ColladaParserAutoGen14Private::_freeAttributes__control_vertices);
functionMap[HASH_ELEMENT_CONTROLLER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__controller, &ColladaParserAutoGen14Private::_data__controller, &ColladaParserAutoGen14Private::_end__controller, &ColladaParserAutoGen14Private::_preBegin__controller, &ColladaParserAutoGen14Private::_preEnd__controller, &ColladaParserAutoGen14Private::_freeAttributes__controller);
functionMap[HASH_ELEMENT_CONVEX_MESH] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__convex_mesh, &ColladaParserAutoGen14Private::_data__convex_mesh, &ColladaParserAutoGen14Private::_end__convex_mesh, &ColladaParserAutoGen14Private::_preBegin__convex_mesh, &ColladaParserAutoGen14Private::_preEnd__convex_mesh, &ColladaParserAutoGen14Private::_freeAttributes__convex_mesh);
functionMap[HASH_ELEMENT_CYLINDER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__cylinder, &ColladaParserAutoGen14Private::_data__cylinder, &ColladaParserAutoGen14Private::_end__cylinder, &ColladaParserAutoGen14Private::_preBegin__cylinder, &ColladaParserAutoGen14Private::_preEnd__cylinder, &ColladaParserAutoGen14Private::_freeAttributes__cylinder);
functionMap[HASH_ELEMENT_DIFFUSE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__diffuse, &ColladaParserAutoGen14Private::_data__diffuse, &ColladaParserAutoGen14Private::_end__diffuse, &ColladaParserAutoGen14Private::_preBegin__diffuse, &ColladaParserAutoGen14Private::_preEnd__diffuse, &ColladaParserAutoGen14Private::_freeAttributes__diffuse);
functionMap[HASH_ELEMENT_EFFECT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__effect, &ColladaParserAutoGen14Private::_data__effect, &ColladaParserAutoGen14Private::_end__effect, &ColladaParserAutoGen14Private::_preBegin__effect, &ColladaParserAutoGen14Private::_preEnd__effect, &ColladaParserAutoGen14Private::_freeAttributes__effect);
functionMap[HASH_ELEMENT_EMISSION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__emission, &ColladaParserAutoGen14Private::_data__emission, &ColladaParserAutoGen14Private::_end__emission, &ColladaParserAutoGen14Private::_preBegin__emission, &ColladaParserAutoGen14Private::_preEnd__emission, &ColladaParserAutoGen14Private::_freeAttributes__emission);
functionMap[HASH_ELEMENT_EVALUATE_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__evaluate_scene, &ColladaParserAutoGen14Private::_data__evaluate_scene, &ColladaParserAutoGen14Private::_end__evaluate_scene, &ColladaParserAutoGen14Private::_preBegin__evaluate_scene, &ColladaParserAutoGen14Private::_preEnd__evaluate_scene, &ColladaParserAutoGen14Private::_freeAttributes__evaluate_scene);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__extra, &ColladaParserAutoGen14Private::_data__extra, &ColladaParserAutoGen14Private::_end__extra, &ColladaParserAutoGen14Private::_preBegin__extra, &ColladaParserAutoGen14Private::_preEnd__extra, &ColladaParserAutoGen14Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_FORCE_FIELD] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__force_field, &ColladaParserAutoGen14Private::_data__force_field, &ColladaParserAutoGen14Private::_end__force_field, &ColladaParserAutoGen14Private::_preBegin__force_field, &ColladaParserAutoGen14Private::_preEnd__force_field, &ColladaParserAutoGen14Private::_freeAttributes__force_field);
functionMap[HASH_ELEMENT_FORMAT_HINT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__format_hint, &ColladaParserAutoGen14Private::_data__format_hint, &ColladaParserAutoGen14Private::_end__format_hint, &ColladaParserAutoGen14Private::_preBegin__format_hint, &ColladaParserAutoGen14Private::_preEnd__format_hint, &ColladaParserAutoGen14Private::_freeAttributes__format_hint);
functionMap[HASH_ELEMENT_GLSL_SURFACE_TYPE____GENERATOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__glsl_surface_type____generator, &ColladaParserAutoGen14Private::_data__glsl_surface_type____generator, &ColladaParserAutoGen14Private::_end__glsl_surface_type____generator, &ColladaParserAutoGen14Private::_preBegin__glsl_surface_type____generator, &ColladaParserAutoGen14Private::_preEnd__glsl_surface_type____generator, &ColladaParserAutoGen14Private::_freeAttributes__glsl_surface_type____generator);
functionMap[HASH_ELEMENT_GEOMETRY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__geometry, &ColladaParserAutoGen14Private::_data__geometry, &ColladaParserAutoGen14Private::_end__geometry, &ColladaParserAutoGen14Private::_preBegin__geometry, &ColladaParserAutoGen14Private::_preEnd__geometry, &ColladaParserAutoGen14Private::_freeAttributes__geometry);
functionMap[HASH_ELEMENT_IMAGE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__image, &ColladaParserAutoGen14Private::_data__image, &ColladaParserAutoGen14Private::_end__image, &ColladaParserAutoGen14Private::_preBegin__image, &ColladaParserAutoGen14Private::_preEnd__image, &ColladaParserAutoGen14Private::_freeAttributes__image);
functionMap[HASH_ELEMENT_IMAGER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__imager, &ColladaParserAutoGen14Private::_data__imager, &ColladaParserAutoGen14Private::_end__imager, &ColladaParserAutoGen14Private::_preBegin__imager, &ColladaParserAutoGen14Private::_preEnd__imager, &ColladaParserAutoGen14Private::_freeAttributes__imager);
functionMap[HASH_ELEMENT_INSTANCE_ANIMATION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_animation, &ColladaParserAutoGen14Private::_data__instance_animation, &ColladaParserAutoGen14Private::_end__instance_animation, &ColladaParserAutoGen14Private::_preBegin__instance_animation, &ColladaParserAutoGen14Private::_preEnd__instance_animation, &ColladaParserAutoGen14Private::_freeAttributes__instance_animation);
functionMap[HASH_ELEMENT_INSTANCE_CAMERA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_camera, &ColladaParserAutoGen14Private::_data__instance_camera, &ColladaParserAutoGen14Private::_end__instance_camera, &ColladaParserAutoGen14Private::_preBegin__instance_camera, &ColladaParserAutoGen14Private::_preEnd__instance_camera, &ColladaParserAutoGen14Private::_freeAttributes__instance_camera);
functionMap[HASH_ELEMENT_INSTANCE_CONTROLLER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_controller, &ColladaParserAutoGen14Private::_data__instance_controller, &ColladaParserAutoGen14Private::_end__instance_controller, &ColladaParserAutoGen14Private::_preBegin__instance_controller, &ColladaParserAutoGen14Private::_preEnd__instance_controller, &ColladaParserAutoGen14Private::_freeAttributes__instance_controller);
functionMap[HASH_ELEMENT_INSTANCE_EFFECT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_effect, &ColladaParserAutoGen14Private::_data__instance_effect, &ColladaParserAutoGen14Private::_end__instance_effect, &ColladaParserAutoGen14Private::_preBegin__instance_effect, &ColladaParserAutoGen14Private::_preEnd__instance_effect, &ColladaParserAutoGen14Private::_freeAttributes__instance_effect);
functionMap[HASH_ELEMENT_INSTANCE_FORCE_FIELD] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_force_field, &ColladaParserAutoGen14Private::_data__instance_force_field, &ColladaParserAutoGen14Private::_end__instance_force_field, &ColladaParserAutoGen14Private::_preBegin__instance_force_field, &ColladaParserAutoGen14Private::_preEnd__instance_force_field, &ColladaParserAutoGen14Private::_freeAttributes__instance_force_field);
functionMap[HASH_ELEMENT_INSTANCE_GEOMETRY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_geometry, &ColladaParserAutoGen14Private::_data__instance_geometry, &ColladaParserAutoGen14Private::_end__instance_geometry, &ColladaParserAutoGen14Private::_preBegin__instance_geometry, &ColladaParserAutoGen14Private::_preEnd__instance_geometry, &ColladaParserAutoGen14Private::_freeAttributes__instance_geometry);
functionMap[HASH_ELEMENT_INSTANCE_LIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_light, &ColladaParserAutoGen14Private::_data__instance_light, &ColladaParserAutoGen14Private::_end__instance_light, &ColladaParserAutoGen14Private::_preBegin__instance_light, &ColladaParserAutoGen14Private::_preEnd__instance_light, &ColladaParserAutoGen14Private::_freeAttributes__instance_light);
functionMap[HASH_ELEMENT_INSTANCE_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_material, &ColladaParserAutoGen14Private::_data__instance_material, &ColladaParserAutoGen14Private::_end__instance_material, &ColladaParserAutoGen14Private::_preBegin__instance_material, &ColladaParserAutoGen14Private::_preEnd__instance_material, &ColladaParserAutoGen14Private::_freeAttributes__instance_material);
functionMap[HASH_ELEMENT_INSTANCE_NODE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_node, &ColladaParserAutoGen14Private::_data__instance_node, &ColladaParserAutoGen14Private::_end__instance_node, &ColladaParserAutoGen14Private::_preBegin__instance_node, &ColladaParserAutoGen14Private::_preEnd__instance_node, &ColladaParserAutoGen14Private::_freeAttributes__instance_node);
functionMap[HASH_ELEMENT_INSTANCE_PHYSICS_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_physics_material, &ColladaParserAutoGen14Private::_data__instance_physics_material, &ColladaParserAutoGen14Private::_end__instance_physics_material, &ColladaParserAutoGen14Private::_preBegin__instance_physics_material, &ColladaParserAutoGen14Private::_preEnd__instance_physics_material, &ColladaParserAutoGen14Private::_freeAttributes__instance_physics_material);
functionMap[HASH_ELEMENT_INSTANCE_PHYSICS_MODEL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_physics_model, &ColladaParserAutoGen14Private::_data__instance_physics_model, &ColladaParserAutoGen14Private::_end__instance_physics_model, &ColladaParserAutoGen14Private::_preBegin__instance_physics_model, &ColladaParserAutoGen14Private::_preEnd__instance_physics_model, &ColladaParserAutoGen14Private::_freeAttributes__instance_physics_model);
functionMap[HASH_ELEMENT_INSTANCE_PHYSICS_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_physics_scene, &ColladaParserAutoGen14Private::_data__instance_physics_scene, &ColladaParserAutoGen14Private::_end__instance_physics_scene, &ColladaParserAutoGen14Private::_preBegin__instance_physics_scene, &ColladaParserAutoGen14Private::_preEnd__instance_physics_scene, &ColladaParserAutoGen14Private::_freeAttributes__instance_physics_scene);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body, &ColladaParserAutoGen14Private::_data__instance_rigid_body, &ColladaParserAutoGen14Private::_end__instance_rigid_body, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_CONSTRAINT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_constraint, &ColladaParserAutoGen14Private::_data__instance_rigid_constraint, &ColladaParserAutoGen14Private::_end__instance_rigid_constraint, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_constraint, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_constraint, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_constraint);
functionMap[HASH_ELEMENT_INSTANCE_VISUAL_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_visual_scene, &ColladaParserAutoGen14Private::_data__instance_visual_scene, &ColladaParserAutoGen14Private::_end__instance_visual_scene, &ColladaParserAutoGen14Private::_preBegin__instance_visual_scene, &ColladaParserAutoGen14Private::_preEnd__instance_visual_scene, &ColladaParserAutoGen14Private::_freeAttributes__instance_visual_scene);
functionMap[HASH_ELEMENT_JOINTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__joints, &ColladaParserAutoGen14Private::_data__joints, &ColladaParserAutoGen14Private::_end__joints, &ColladaParserAutoGen14Private::_preBegin__joints, &ColladaParserAutoGen14Private::_preEnd__joints, &ColladaParserAutoGen14Private::_freeAttributes__joints);
functionMap[HASH_ELEMENT_LAMBERT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__lambert, &ColladaParserAutoGen14Private::_data__lambert, &ColladaParserAutoGen14Private::_end__lambert, &ColladaParserAutoGen14Private::_preBegin__lambert, &ColladaParserAutoGen14Private::_preEnd__lambert, &ColladaParserAutoGen14Private::_freeAttributes__lambert);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATION_CLIPS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_animation_clips, &ColladaParserAutoGen14Private::_data__library_animation_clips, &ColladaParserAutoGen14Private::_end__library_animation_clips, &ColladaParserAutoGen14Private::_preBegin__library_animation_clips, &ColladaParserAutoGen14Private::_preEnd__library_animation_clips, &ColladaParserAutoGen14Private::_freeAttributes__library_animation_clips);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATIONS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_animations, &ColladaParserAutoGen14Private::_data__library_animations, &ColladaParserAutoGen14Private::_end__library_animations, &ColladaParserAutoGen14Private::_preBegin__library_animations, &ColladaParserAutoGen14Private::_preEnd__library_animations, &ColladaParserAutoGen14Private::_freeAttributes__library_animations);
functionMap[HASH_ELEMENT_LIBRARY_CAMERAS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_cameras, &ColladaParserAutoGen14Private::_data__library_cameras, &ColladaParserAutoGen14Private::_end__library_cameras, &ColladaParserAutoGen14Private::_preBegin__library_cameras, &ColladaParserAutoGen14Private::_preEnd__library_cameras, &ColladaParserAutoGen14Private::_freeAttributes__library_cameras);
functionMap[HASH_ELEMENT_LIBRARY_CONTROLLERS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_controllers, &ColladaParserAutoGen14Private::_data__library_controllers, &ColladaParserAutoGen14Private::_end__library_controllers, &ColladaParserAutoGen14Private::_preBegin__library_controllers, &ColladaParserAutoGen14Private::_preEnd__library_controllers, &ColladaParserAutoGen14Private::_freeAttributes__library_controllers);
functionMap[HASH_ELEMENT_LIBRARY_EFFECTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_effects, &ColladaParserAutoGen14Private::_data__library_effects, &ColladaParserAutoGen14Private::_end__library_effects, &ColladaParserAutoGen14Private::_preBegin__library_effects, &ColladaParserAutoGen14Private::_preEnd__library_effects, &ColladaParserAutoGen14Private::_freeAttributes__library_effects);
functionMap[HASH_ELEMENT_LIBRARY_FORCE_FIELDS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_force_fields, &ColladaParserAutoGen14Private::_data__library_force_fields, &ColladaParserAutoGen14Private::_end__library_force_fields, &ColladaParserAutoGen14Private::_preBegin__library_force_fields, &ColladaParserAutoGen14Private::_preEnd__library_force_fields, &ColladaParserAutoGen14Private::_freeAttributes__library_force_fields);
functionMap[HASH_ELEMENT_LIBRARY_GEOMETRIES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_geometries, &ColladaParserAutoGen14Private::_data__library_geometries, &ColladaParserAutoGen14Private::_end__library_geometries, &ColladaParserAutoGen14Private::_preBegin__library_geometries, &ColladaParserAutoGen14Private::_preEnd__library_geometries, &ColladaParserAutoGen14Private::_freeAttributes__library_geometries);
functionMap[HASH_ELEMENT_LIBRARY_IMAGES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_images, &ColladaParserAutoGen14Private::_data__library_images, &ColladaParserAutoGen14Private::_end__library_images, &ColladaParserAutoGen14Private::_preBegin__library_images, &ColladaParserAutoGen14Private::_preEnd__library_images, &ColladaParserAutoGen14Private::_freeAttributes__library_images);
functionMap[HASH_ELEMENT_LIBRARY_LIGHTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_lights, &ColladaParserAutoGen14Private::_data__library_lights, &ColladaParserAutoGen14Private::_end__library_lights, &ColladaParserAutoGen14Private::_preBegin__library_lights, &ColladaParserAutoGen14Private::_preEnd__library_lights, &ColladaParserAutoGen14Private::_freeAttributes__library_lights);
functionMap[HASH_ELEMENT_LIBRARY_MATERIALS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_materials, &ColladaParserAutoGen14Private::_data__library_materials, &ColladaParserAutoGen14Private::_end__library_materials, &ColladaParserAutoGen14Private::_preBegin__library_materials, &ColladaParserAutoGen14Private::_preEnd__library_materials, &ColladaParserAutoGen14Private::_freeAttributes__library_materials);
functionMap[HASH_ELEMENT_LIBRARY_NODES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_nodes, &ColladaParserAutoGen14Private::_data__library_nodes, &ColladaParserAutoGen14Private::_end__library_nodes, &ColladaParserAutoGen14Private::_preBegin__library_nodes, &ColladaParserAutoGen14Private::_preEnd__library_nodes, &ColladaParserAutoGen14Private::_freeAttributes__library_nodes);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MATERIALS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_materials, &ColladaParserAutoGen14Private::_data__library_physics_materials, &ColladaParserAutoGen14Private::_end__library_physics_materials, &ColladaParserAutoGen14Private::_preBegin__library_physics_materials, &ColladaParserAutoGen14Private::_preEnd__library_physics_materials, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_materials);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MODELS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_models, &ColladaParserAutoGen14Private::_data__library_physics_models, &ColladaParserAutoGen14Private::_end__library_physics_models, &ColladaParserAutoGen14Private::_preBegin__library_physics_models, &ColladaParserAutoGen14Private::_preEnd__library_physics_models, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_models);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_SCENES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_scenes, &ColladaParserAutoGen14Private::_data__library_physics_scenes, &ColladaParserAutoGen14Private::_end__library_physics_scenes, &ColladaParserAutoGen14Private::_preBegin__library_physics_scenes, &ColladaParserAutoGen14Private::_preEnd__library_physics_scenes, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_scenes);
functionMap[HASH_ELEMENT_LIBRARY_VISUAL_SCENES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_visual_scenes, &ColladaParserAutoGen14Private::_data__library_visual_scenes, &ColladaParserAutoGen14Private::_end__library_visual_scenes, &ColladaParserAutoGen14Private::_preBegin__library_visual_scenes, &ColladaParserAutoGen14Private::_preEnd__library_visual_scenes, &ColladaParserAutoGen14Private::_freeAttributes__library_visual_scenes);
functionMap[HASH_ELEMENT_LIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__light, &ColladaParserAutoGen14Private::_data__light, &ColladaParserAutoGen14Private::_end__light, &ColladaParserAutoGen14Private::_preBegin__light, &ColladaParserAutoGen14Private::_preEnd__light, &ColladaParserAutoGen14Private::_freeAttributes__light);
functionMap[HASH_ELEMENT_LINES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__lines, &ColladaParserAutoGen14Private::_data__lines, &ColladaParserAutoGen14Private::_end__lines, &ColladaParserAutoGen14Private::_preBegin__lines, &ColladaParserAutoGen14Private::_preEnd__lines, &ColladaParserAutoGen14Private::_freeAttributes__lines);
functionMap[HASH_ELEMENT_LINESTRIPS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__linestrips, &ColladaParserAutoGen14Private::_data__linestrips, &ColladaParserAutoGen14Private::_end__linestrips, &ColladaParserAutoGen14Private::_preBegin__linestrips, &ColladaParserAutoGen14Private::_preEnd__linestrips, &ColladaParserAutoGen14Private::_freeAttributes__linestrips);
functionMap[HASH_ELEMENT_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__material, &ColladaParserAutoGen14Private::_data__material, &ColladaParserAutoGen14Private::_end__material, &ColladaParserAutoGen14Private::_preBegin__material, &ColladaParserAutoGen14Private::_preEnd__material, &ColladaParserAutoGen14Private::_freeAttributes__material);
functionMap[HASH_ELEMENT_MESH] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mesh, &ColladaParserAutoGen14Private::_data__mesh, &ColladaParserAutoGen14Private::_end__mesh, &ColladaParserAutoGen14Private::_preBegin__mesh, &ColladaParserAutoGen14Private::_preEnd__mesh, &ColladaParserAutoGen14Private::_freeAttributes__mesh);
functionMap[HASH_ELEMENT_MORPH] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__morph, &ColladaParserAutoGen14Private::_data__morph, &ColladaParserAutoGen14Private::_end__morph, &ColladaParserAutoGen14Private::_preBegin__morph, &ColladaParserAutoGen14Private::_preEnd__morph, &ColladaParserAutoGen14Private::_freeAttributes__morph);
functionMap[HASH_ELEMENT_NEWPARAM____FX_NEWPARAM_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__newparam____fx_newparam_common, &ColladaParserAutoGen14Private::_data__newparam____fx_newparam_common, &ColladaParserAutoGen14Private::_end__newparam____fx_newparam_common, &ColladaParserAutoGen14Private::_preBegin__newparam____fx_newparam_common, &ColladaParserAutoGen14Private::_preEnd__newparam____fx_newparam_common, &ColladaParserAutoGen14Private::_freeAttributes__newparam____fx_newparam_common);
functionMap[HASH_ELEMENT_NODE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__node, &ColladaParserAutoGen14Private::_data__node, &ColladaParserAutoGen14Private::_end__node, &ColladaParserAutoGen14Private::_preBegin__node, &ColladaParserAutoGen14Private::_preEnd__node, &ColladaParserAutoGen14Private::_freeAttributes__node);
functionMap[HASH_ELEMENT_OPTICS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__optics, &ColladaParserAutoGen14Private::_data__optics, &ColladaParserAutoGen14Private::_end__optics, &ColladaParserAutoGen14Private::_preBegin__optics, &ColladaParserAutoGen14Private::_preEnd__optics, &ColladaParserAutoGen14Private::_freeAttributes__optics);
functionMap[HASH_ELEMENT_PROFILE_GLSL__TECHNIQUE__PASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLSL__technique__pass, &ColladaParserAutoGen14Private::_data__profile_GLSL__technique__pass, &ColladaParserAutoGen14Private::_end__profile_GLSL__technique__pass, &ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass, &ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL__technique__pass);
functionMap[HASH_ELEMENT_PHONG] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__phong, &ColladaParserAutoGen14Private::_data__phong, &ColladaParserAutoGen14Private::_end__phong, &ColladaParserAutoGen14Private::_preBegin__phong, &ColladaParserAutoGen14Private::_preEnd__phong, &ColladaParserAutoGen14Private::_freeAttributes__phong);
functionMap[HASH_ELEMENT_PHYSICS_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_material, &ColladaParserAutoGen14Private::_data__physics_material, &ColladaParserAutoGen14Private::_end__physics_material, &ColladaParserAutoGen14Private::_preBegin__physics_material, &ColladaParserAutoGen14Private::_preEnd__physics_material, &ColladaParserAutoGen14Private::_freeAttributes__physics_material);
functionMap[HASH_ELEMENT_PHYSICS_MODEL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_model, &ColladaParserAutoGen14Private::_data__physics_model, &ColladaParserAutoGen14Private::_end__physics_model, &ColladaParserAutoGen14Private::_preBegin__physics_model, &ColladaParserAutoGen14Private::_preEnd__physics_model, &ColladaParserAutoGen14Private::_freeAttributes__physics_model);
functionMap[HASH_ELEMENT_PHYSICS_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_scene, &ColladaParserAutoGen14Private::_data__physics_scene, &ColladaParserAutoGen14Private::_end__physics_scene, &ColladaParserAutoGen14Private::_preBegin__physics_scene, &ColladaParserAutoGen14Private::_preEnd__physics_scene, &ColladaParserAutoGen14Private::_freeAttributes__physics_scene);
functionMap[HASH_ELEMENT_PLANE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__plane, &ColladaParserAutoGen14Private::_data__plane, &ColladaParserAutoGen14Private::_end__plane, &ColladaParserAutoGen14Private::_preBegin__plane, &ColladaParserAutoGen14Private::_preEnd__plane, &ColladaParserAutoGen14Private::_freeAttributes__plane);
functionMap[HASH_ELEMENT_POLYGONS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__polygons, &ColladaParserAutoGen14Private::_data__polygons, &ColladaParserAutoGen14Private::_end__polygons, &ColladaParserAutoGen14Private::_preBegin__polygons, &ColladaParserAutoGen14Private::_preEnd__polygons, &ColladaParserAutoGen14Private::_freeAttributes__polygons);
functionMap[HASH_ELEMENT_POLYLIST] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__polylist, &ColladaParserAutoGen14Private::_data__polylist, &ColladaParserAutoGen14Private::_end__polylist, &ColladaParserAutoGen14Private::_preBegin__polylist, &ColladaParserAutoGen14Private::_preEnd__polylist, &ColladaParserAutoGen14Private::_freeAttributes__polylist);
functionMap[HASH_ELEMENT_PROFILE_CG] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_CG, &ColladaParserAutoGen14Private::_data__profile_CG, &ColladaParserAutoGen14Private::_end__profile_CG, &ColladaParserAutoGen14Private::_preBegin__profile_CG, &ColladaParserAutoGen14Private::_preEnd__profile_CG, &ColladaParserAutoGen14Private::_freeAttributes__profile_CG);
functionMap[HASH_ELEMENT_PROFILE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_COMMON, &ColladaParserAutoGen14Private::_data__profile_COMMON, &ColladaParserAutoGen14Private::_end__profile_COMMON, &ColladaParserAutoGen14Private::_preBegin__profile_COMMON, &ColladaParserAutoGen14Private::_preEnd__profile_COMMON, &ColladaParserAutoGen14Private::_freeAttributes__profile_COMMON);
functionMap[HASH_ELEMENT_PROFILE_GLES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLES, &ColladaParserAutoGen14Private::_data__profile_GLES, &ColladaParserAutoGen14Private::_end__profile_GLES, &ColladaParserAutoGen14Private::_preBegin__profile_GLES, &ColladaParserAutoGen14Private::_preEnd__profile_GLES, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLES);
functionMap[HASH_ELEMENT_PROFILE_GLSL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLSL, &ColladaParserAutoGen14Private::_data__profile_GLSL, &ColladaParserAutoGen14Private::_end__profile_GLSL, &ColladaParserAutoGen14Private::_preBegin__profile_GLSL, &ColladaParserAutoGen14Private::_preEnd__profile_GLSL, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL);
functionMap[HASH_ELEMENT_REF_ATTACHMENT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__ref_attachment, &ColladaParserAutoGen14Private::_data__ref_attachment, &ColladaParserAutoGen14Private::_end__ref_attachment, &ColladaParserAutoGen14Private::_preBegin__ref_attachment, &ColladaParserAutoGen14Private::_preEnd__ref_attachment, &ColladaParserAutoGen14Private::_freeAttributes__ref_attachment);
functionMap[HASH_ELEMENT_REFLECTIVE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__reflective, &ColladaParserAutoGen14Private::_data__reflective, &ColladaParserAutoGen14Private::_end__reflective, &ColladaParserAutoGen14Private::_preBegin__reflective, &ColladaParserAutoGen14Private::_preEnd__reflective, &ColladaParserAutoGen14Private::_freeAttributes__reflective);
functionMap[HASH_ELEMENT_RENDER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__render, &ColladaParserAutoGen14Private::_data__render, &ColladaParserAutoGen14Private::_end__render, &ColladaParserAutoGen14Private::_preBegin__render, &ColladaParserAutoGen14Private::_preEnd__render, &ColladaParserAutoGen14Private::_freeAttributes__render);
functionMap[HASH_ELEMENT_RIGID_BODY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body, &ColladaParserAutoGen14Private::_data__rigid_body, &ColladaParserAutoGen14Private::_end__rigid_body, &ColladaParserAutoGen14Private::_preBegin__rigid_body, &ColladaParserAutoGen14Private::_preEnd__rigid_body, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body);
functionMap[HASH_ELEMENT_RIGID_CONSTRAINT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_constraint, &ColladaParserAutoGen14Private::_data__rigid_constraint, &ColladaParserAutoGen14Private::_end__rigid_constraint, &ColladaParserAutoGen14Private::_preBegin__rigid_constraint, &ColladaParserAutoGen14Private::_preEnd__rigid_constraint, &ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint);
functionMap[HASH_ELEMENT_SAMPLER1D____FX_SAMPLER1D_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__sampler1D____fx_sampler1D_common, &ColladaParserAutoGen14Private::_data__sampler1D____fx_sampler1D_common, &ColladaParserAutoGen14Private::_end__sampler1D____fx_sampler1D_common, &ColladaParserAutoGen14Private::_preBegin__sampler1D____fx_sampler1D_common, &ColladaParserAutoGen14Private::_preEnd__sampler1D____fx_sampler1D_common, &ColladaParserAutoGen14Private::_freeAttributes__sampler1D____fx_sampler1D_common);
functionMap[HASH_ELEMENT_SAMPLER2D____FX_SAMPLER2D_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__sampler2D____fx_sampler2D_common, &ColladaParserAutoGen14Private::_data__sampler2D____fx_sampler2D_common, &ColladaParserAutoGen14Private::_end__sampler2D____fx_sampler2D_common, &ColladaParserAutoGen14Private::_preBegin__sampler2D____fx_sampler2D_common, &ColladaParserAutoGen14Private::_preEnd__sampler2D____fx_sampler2D_common, &ColladaParserAutoGen14Private::_freeAttributes__sampler2D____fx_sampler2D_common);
functionMap[HASH_ELEMENT_SAMPLER3D____FX_SAMPLER3D_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__sampler3D____fx_sampler3D_common, &ColladaParserAutoGen14Private::_data__sampler3D____fx_sampler3D_common, &ColladaParserAutoGen14Private::_end__sampler3D____fx_sampler3D_common, &ColladaParserAutoGen14Private::_preBegin__sampler3D____fx_sampler3D_common, &ColladaParserAutoGen14Private::_preEnd__sampler3D____fx_sampler3D_common, &ColladaParserAutoGen14Private::_freeAttributes__sampler3D____fx_sampler3D_common);
functionMap[HASH_ELEMENT_SAMPLERCUBE____FX_SAMPLERCUBE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__samplerCUBE____fx_samplerCUBE_common, &ColladaParserAutoGen14Private::_data__samplerCUBE____fx_samplerCUBE_common, &ColladaParserAutoGen14Private::_end__samplerCUBE____fx_samplerCUBE_common, &ColladaParserAutoGen14Private::_preBegin__samplerCUBE____fx_samplerCUBE_common, &ColladaParserAutoGen14Private::_preEnd__samplerCUBE____fx_samplerCUBE_common, &ColladaParserAutoGen14Private::_freeAttributes__samplerCUBE____fx_samplerCUBE_common);
functionMap[HASH_ELEMENT_SAMPLERDEPTH____FX_SAMPLERDEPTH_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__samplerDEPTH____fx_samplerDEPTH_common, &ColladaParserAutoGen14Private::_data__samplerDEPTH____fx_samplerDEPTH_common, &ColladaParserAutoGen14Private::_end__samplerDEPTH____fx_samplerDEPTH_common, &ColladaParserAutoGen14Private::_preBegin__samplerDEPTH____fx_samplerDEPTH_common, &ColladaParserAutoGen14Private::_preEnd__samplerDEPTH____fx_samplerDEPTH_common, &ColladaParserAutoGen14Private::_freeAttributes__samplerDEPTH____fx_samplerDEPTH_common);
functionMap[HASH_ELEMENT_SAMPLERRECT____FX_SAMPLERRECT_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__samplerRECT____fx_samplerRECT_common, &ColladaParserAutoGen14Private::_data__samplerRECT____fx_samplerRECT_common, &ColladaParserAutoGen14Private::_end__samplerRECT____fx_samplerRECT_common, &ColladaParserAutoGen14Private::_preBegin__samplerRECT____fx_samplerRECT_common, &ColladaParserAutoGen14Private::_preEnd__samplerRECT____fx_samplerRECT_common, &ColladaParserAutoGen14Private::_freeAttributes__samplerRECT____fx_samplerRECT_common);
functionMap[HASH_ELEMENT_SAMPLER_STATE____GLES_SAMPLER_STATE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__sampler_state____gles_sampler_state, &ColladaParserAutoGen14Private::_data__sampler_state____gles_sampler_state, &ColladaParserAutoGen14Private::_end__sampler_state____gles_sampler_state, &ColladaParserAutoGen14Private::_preBegin__sampler_state____gles_sampler_state, &ColladaParserAutoGen14Private::_preEnd__sampler_state____gles_sampler_state, &ColladaParserAutoGen14Private::_freeAttributes__sampler_state____gles_sampler_state);
functionMap[HASH_ELEMENT_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__scene, &ColladaParserAutoGen14Private::_data__scene, &ColladaParserAutoGen14Private::_end__scene, &ColladaParserAutoGen14Private::_preBegin__scene, &ColladaParserAutoGen14Private::_preEnd__scene, &ColladaParserAutoGen14Private::_freeAttributes__scene);
functionMap[HASH_ELEMENT_INSTANCE_EFFECT__SETPARAM] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_effect__setparam, &ColladaParserAutoGen14Private::_data__instance_effect__setparam, &ColladaParserAutoGen14Private::_end__instance_effect__setparam, &ColladaParserAutoGen14Private::_preBegin__instance_effect__setparam, &ColladaParserAutoGen14Private::_preEnd__instance_effect__setparam, &ColladaParserAutoGen14Private::_freeAttributes__instance_effect__setparam);
functionMap[HASH_ELEMENT_PROFILE_GLSL__TECHNIQUE__PASS__SHADER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLSL__technique__pass__shader, &ColladaParserAutoGen14Private::_data__profile_GLSL__technique__pass__shader, &ColladaParserAutoGen14Private::_end__profile_GLSL__technique__pass__shader, &ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__shader, &ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass__shader, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLSL__technique__pass__shader);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__shape);
functionMap[HASH_ELEMENT_SKIN] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__skin, &ColladaParserAutoGen14Private::_data__skin, &ColladaParserAutoGen14Private::_end__skin, &ColladaParserAutoGen14Private::_preBegin__skin, &ColladaParserAutoGen14Private::_preEnd__skin, &ColladaParserAutoGen14Private::_freeAttributes__skin);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__source, &ColladaParserAutoGen14Private::_data__source, &ColladaParserAutoGen14Private::_end__source, &ColladaParserAutoGen14Private::_preBegin__source, &ColladaParserAutoGen14Private::_preEnd__source, &ColladaParserAutoGen14Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_SPECULAR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__specular, &ColladaParserAutoGen14Private::_data__specular, &ColladaParserAutoGen14Private::_end__specular, &ColladaParserAutoGen14Private::_preBegin__specular, &ColladaParserAutoGen14Private::_preEnd__specular, &ColladaParserAutoGen14Private::_freeAttributes__specular);
functionMap[HASH_ELEMENT_SPHERE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__sphere, &ColladaParserAutoGen14Private::_data__sphere, &ColladaParserAutoGen14Private::_end__sphere, &ColladaParserAutoGen14Private::_preBegin__sphere, &ColladaParserAutoGen14Private::_preEnd__sphere, &ColladaParserAutoGen14Private::_freeAttributes__sphere);
functionMap[HASH_ELEMENT_SPLINE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__spline, &ColladaParserAutoGen14Private::_data__spline, &ColladaParserAutoGen14Private::_end__spline, &ColladaParserAutoGen14Private::_preBegin__spline, &ColladaParserAutoGen14Private::_preEnd__spline, &ColladaParserAutoGen14Private::_freeAttributes__spline);
functionMap[HASH_ELEMENT_SURFACE____FX_SURFACE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__surface____fx_surface_common, &ColladaParserAutoGen14Private::_data__surface____fx_surface_common, &ColladaParserAutoGen14Private::_end__surface____fx_surface_common, &ColladaParserAutoGen14Private::_preBegin__surface____fx_surface_common, &ColladaParserAutoGen14Private::_preEnd__surface____fx_surface_common, &ColladaParserAutoGen14Private::_freeAttributes__surface____fx_surface_common);
functionMap[HASH_ELEMENT_TAPERED_CAPSULE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__tapered_capsule, &ColladaParserAutoGen14Private::_data__tapered_capsule, &ColladaParserAutoGen14Private::_end__tapered_capsule, &ColladaParserAutoGen14Private::_preBegin__tapered_capsule, &ColladaParserAutoGen14Private::_preEnd__tapered_capsule, &ColladaParserAutoGen14Private::_freeAttributes__tapered_capsule);
functionMap[HASH_ELEMENT_TAPERED_CYLINDER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__tapered_cylinder, &ColladaParserAutoGen14Private::_data__tapered_cylinder, &ColladaParserAutoGen14Private::_end__tapered_cylinder, &ColladaParserAutoGen14Private::_preBegin__tapered_cylinder, &ColladaParserAutoGen14Private::_preEnd__tapered_cylinder, &ColladaParserAutoGen14Private::_freeAttributes__tapered_cylinder);
functionMap[HASH_ELEMENT_TARGETS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__targets, &ColladaParserAutoGen14Private::_data__targets, &ColladaParserAutoGen14Private::_end__targets, &ColladaParserAutoGen14Private::_preBegin__targets, &ColladaParserAutoGen14Private::_preEnd__targets, &ColladaParserAutoGen14Private::_freeAttributes__targets);
functionMap[HASH_ELEMENT_PROFILE_GLES__TECHNIQUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLES__technique, &ColladaParserAutoGen14Private::_data__profile_GLES__technique, &ColladaParserAutoGen14Private::_end__profile_GLES__technique, &ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique, &ColladaParserAutoGen14Private::_preEnd__profile_GLES__technique, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLES__technique);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common);
functionMap[HASH_ELEMENT_TEXCOMBINER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__texcombiner, &ColladaParserAutoGen14Private::_data__texcombiner, &ColladaParserAutoGen14Private::_end__texcombiner, &ColladaParserAutoGen14Private::_preBegin__texcombiner, &ColladaParserAutoGen14Private::_preEnd__texcombiner, &ColladaParserAutoGen14Private::_freeAttributes__texcombiner);
functionMap[HASH_ELEMENT_TEXENV] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__texenv, &ColladaParserAutoGen14Private::_data__texenv, &ColladaParserAutoGen14Private::_end__texenv, &ColladaParserAutoGen14Private::_preBegin__texenv, &ColladaParserAutoGen14Private::_preEnd__texenv, &ColladaParserAutoGen14Private::_freeAttributes__texenv);
functionMap[HASH_ELEMENT_TEXTURE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__texture, &ColladaParserAutoGen14Private::_data__texture, &ColladaParserAutoGen14Private::_end__texture, &ColladaParserAutoGen14Private::_preBegin__texture, &ColladaParserAutoGen14Private::_preEnd__texture, &ColladaParserAutoGen14Private::_freeAttributes__texture);
functionMap[HASH_ELEMENT_TEXTURE1D] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__texture1D, &ColladaParserAutoGen14Private::_data__texture1D, &ColladaParserAutoGen14Private::_end__texture1D, &ColladaParserAutoGen14Private::_preBegin__texture1D, &ColladaParserAutoGen14Private::_preEnd__texture1D, &ColladaParserAutoGen14Private::_freeAttributes__texture1D);
functionMap[HASH_ELEMENT_TEXTURE2D] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__texture2D, &ColladaParserAutoGen14Private::_data__texture2D, &ColladaParserAutoGen14Private::_end__texture2D, &ColladaParserAutoGen14Private::_preBegin__texture2D, &ColladaParserAutoGen14Private::_preEnd__texture2D, &ColladaParserAutoGen14Private::_freeAttributes__texture2D);
functionMap[HASH_ELEMENT_TEXTURE3D] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__texture3D, &ColladaParserAutoGen14Private::_data__texture3D, &ColladaParserAutoGen14Private::_end__texture3D, &ColladaParserAutoGen14Private::_preBegin__texture3D, &ColladaParserAutoGen14Private::_preEnd__texture3D, &ColladaParserAutoGen14Private::_freeAttributes__texture3D);
functionMap[HASH_ELEMENT_TEXTURECUBE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__textureCUBE, &ColladaParserAutoGen14Private::_data__textureCUBE, &ColladaParserAutoGen14Private::_end__textureCUBE, &ColladaParserAutoGen14Private::_preBegin__textureCUBE, &ColladaParserAutoGen14Private::_preEnd__textureCUBE, &ColladaParserAutoGen14Private::_freeAttributes__textureCUBE);
functionMap[HASH_ELEMENT_TEXTUREDEPTH] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__textureDEPTH, &ColladaParserAutoGen14Private::_data__textureDEPTH, &ColladaParserAutoGen14Private::_end__textureDEPTH, &ColladaParserAutoGen14Private::_preBegin__textureDEPTH, &ColladaParserAutoGen14Private::_preEnd__textureDEPTH, &ColladaParserAutoGen14Private::_freeAttributes__textureDEPTH);
functionMap[HASH_ELEMENT_TEXTURERECT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__textureRECT, &ColladaParserAutoGen14Private::_data__textureRECT, &ColladaParserAutoGen14Private::_end__textureRECT, &ColladaParserAutoGen14Private::_preBegin__textureRECT, &ColladaParserAutoGen14Private::_preEnd__textureRECT, &ColladaParserAutoGen14Private::_freeAttributes__textureRECT);
functionMap[HASH_ELEMENT_PROFILE_GLES__TECHNIQUE__PASS__TEXTURE_PIPELINE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__profile_GLES__technique__pass__texture_pipeline, &ColladaParserAutoGen14Private::_data__profile_GLES__technique__pass__texture_pipeline, &ColladaParserAutoGen14Private::_end__profile_GLES__technique__pass__texture_pipeline, &ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__texture_pipeline, &ColladaParserAutoGen14Private::_preEnd__profile_GLES__technique__pass__texture_pipeline, &ColladaParserAutoGen14Private::_freeAttributes__profile_GLES__technique__pass__texture_pipeline);
functionMap[HASH_ELEMENT_TEXTURE_UNIT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__texture_unit, &ColladaParserAutoGen14Private::_data__texture_unit, &ColladaParserAutoGen14Private::_end__texture_unit, &ColladaParserAutoGen14Private::_preBegin__texture_unit, &ColladaParserAutoGen14Private::_preEnd__texture_unit, &ColladaParserAutoGen14Private::_freeAttributes__texture_unit);
functionMap[HASH_ELEMENT_TRANSPARENT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__transparent, &ColladaParserAutoGen14Private::_data__transparent, &ColladaParserAutoGen14Private::_end__transparent, &ColladaParserAutoGen14Private::_preBegin__transparent, &ColladaParserAutoGen14Private::_preEnd__transparent, &ColladaParserAutoGen14Private::_freeAttributes__transparent);
functionMap[HASH_ELEMENT_TRIANGLES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__triangles, &ColladaParserAutoGen14Private::_data__triangles, &ColladaParserAutoGen14Private::_end__triangles, &ColladaParserAutoGen14Private::_preBegin__triangles, &ColladaParserAutoGen14Private::_preEnd__triangles, &ColladaParserAutoGen14Private::_freeAttributes__triangles);
functionMap[HASH_ELEMENT_TRIFANS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__trifans, &ColladaParserAutoGen14Private::_data__trifans, &ColladaParserAutoGen14Private::_end__trifans, &ColladaParserAutoGen14Private::_preBegin__trifans, &ColladaParserAutoGen14Private::_preEnd__trifans, &ColladaParserAutoGen14Private::_freeAttributes__trifans);
functionMap[HASH_ELEMENT_TRISTRIPS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__tristrips, &ColladaParserAutoGen14Private::_data__tristrips, &ColladaParserAutoGen14Private::_end__tristrips, &ColladaParserAutoGen14Private::_preBegin__tristrips, &ColladaParserAutoGen14Private::_preEnd__tristrips, &ColladaParserAutoGen14Private::_freeAttributes__tristrips);
functionMap[HASH_ELEMENT_USERTYPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__usertype, &ColladaParserAutoGen14Private::_data__usertype, &ColladaParserAutoGen14Private::_end__usertype, &ColladaParserAutoGen14Private::_preBegin__usertype, &ColladaParserAutoGen14Private::_preEnd__usertype, &ColladaParserAutoGen14Private::_freeAttributes__usertype);
functionMap[HASH_ELEMENT_VALUE____GL_SAMPLER1D] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__value____gl_sampler1D, &ColladaParserAutoGen14Private::_data__value____gl_sampler1D, &ColladaParserAutoGen14Private::_end__value____gl_sampler1D, &ColladaParserAutoGen14Private::_preBegin__value____gl_sampler1D, &ColladaParserAutoGen14Private::_preEnd__value____gl_sampler1D, &ColladaParserAutoGen14Private::_freeAttributes__value____gl_sampler1D);
functionMap[HASH_ELEMENT_VERTEX_WEIGHTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__vertex_weights, &ColladaParserAutoGen14Private::_data__vertex_weights, &ColladaParserAutoGen14Private::_end__vertex_weights, &ColladaParserAutoGen14Private::_preBegin__vertex_weights, &ColladaParserAutoGen14Private::_preEnd__vertex_weights, &ColladaParserAutoGen14Private::_freeAttributes__vertex_weights);
functionMap[HASH_ELEMENT_VERTICES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__vertices, &ColladaParserAutoGen14Private::_data__vertices, &ColladaParserAutoGen14Private::_end__vertices, &ColladaParserAutoGen14Private::_preBegin__vertices, &ColladaParserAutoGen14Private::_preEnd__vertices, &ColladaParserAutoGen14Private::_freeAttributes__vertices);
functionMap[HASH_ELEMENT_VISUAL_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__visual_scene, &ColladaParserAutoGen14Private::_data__visual_scene, &ColladaParserAutoGen14Private::_end__visual_scene, &ColladaParserAutoGen14Private::_preBegin__visual_scene, &ColladaParserAutoGen14Private::_preEnd__visual_scene, &ColladaParserAutoGen14Private::_freeAttributes__visual_scene);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__asset, &ColladaParserAutoGen14Private::_data__asset, &ColladaParserAutoGen14Private::_end__asset, &ColladaParserAutoGen14Private::_preBegin__asset, &ColladaParserAutoGen14Private::_preEnd__asset, &ColladaParserAutoGen14Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__contributor, &ColladaParserAutoGen14Private::_data__contributor, &ColladaParserAutoGen14Private::_end__contributor, &ColladaParserAutoGen14Private::_preBegin__contributor, &ColladaParserAutoGen14Private::_preEnd__contributor, &ColladaParserAutoGen14Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__created, &ColladaParserAutoGen14Private::_data__created, &ColladaParserAutoGen14Private::_end__created, &ColladaParserAutoGen14Private::_preBegin__created, &ColladaParserAutoGen14Private::_preEnd__created, &ColladaParserAutoGen14Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__keywords, &ColladaParserAutoGen14Private::_data__keywords, &ColladaParserAutoGen14Private::_end__keywords, &ColladaParserAutoGen14Private::_preBegin__keywords, &ColladaParserAutoGen14Private::_preEnd__keywords, &ColladaParserAutoGen14Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__modified, &ColladaParserAutoGen14Private::_data__modified, &ColladaParserAutoGen14Private::_end__modified, &ColladaParserAutoGen14Private::_preBegin__modified, &ColladaParserAutoGen14Private::_preEnd__modified, &ColladaParserAutoGen14Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__revision, &ColladaParserAutoGen14Private::_data__revision, &ColladaParserAutoGen14Private::_end__revision, &ColladaParserAutoGen14Private::_preBegin__revision, &ColladaParserAutoGen14Private::_preEnd__revision, &ColladaParserAutoGen14Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__subject, &ColladaParserAutoGen14Private::_data__subject, &ColladaParserAutoGen14Private::_end__subject, &ColladaParserAutoGen14Private::_preBegin__subject, &ColladaParserAutoGen14Private::_preEnd__subject, &ColladaParserAutoGen14Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__title, &ColladaParserAutoGen14Private::_data__title, &ColladaParserAutoGen14Private::_end__title, &ColladaParserAutoGen14Private::_preBegin__title, &ColladaParserAutoGen14Private::_preEnd__title, &ColladaParserAutoGen14Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__unit, &ColladaParserAutoGen14Private::_data__unit, &ColladaParserAutoGen14Private::_end__unit, &ColladaParserAutoGen14Private::_preBegin__unit, &ColladaParserAutoGen14Private::_preEnd__unit, &ColladaParserAutoGen14Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__up_axis, &ColladaParserAutoGen14Private::_data__up_axis, &ColladaParserAutoGen14Private::_end__up_axis, &ColladaParserAutoGen14Private::_preBegin__up_axis, &ColladaParserAutoGen14Private::_preEnd__up_axis, &ColladaParserAutoGen14Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__author, &ColladaParserAutoGen14Private::_data__author, &ColladaParserAutoGen14Private::_end__author, &ColladaParserAutoGen14Private::_preBegin__author, &ColladaParserAutoGen14Private::_preEnd__author, &ColladaParserAutoGen14Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__authoring_tool, &ColladaParserAutoGen14Private::_data__authoring_tool, &ColladaParserAutoGen14Private::_end__authoring_tool, &ColladaParserAutoGen14Private::_preBegin__authoring_tool, &ColladaParserAutoGen14Private::_preEnd__authoring_tool, &ColladaParserAutoGen14Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__comments, &ColladaParserAutoGen14Private::_data__comments, &ColladaParserAutoGen14Private::_end__comments, &ColladaParserAutoGen14Private::_preBegin__comments, &ColladaParserAutoGen14Private::_preEnd__comments, &ColladaParserAutoGen14Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__copyright, &ColladaParserAutoGen14Private::_data__copyright, &ColladaParserAutoGen14Private::_end__copyright, &ColladaParserAutoGen14Private::_preBegin__copyright, &ColladaParserAutoGen14Private::_preEnd__copyright, &ColladaParserAutoGen14Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__source_data, &ColladaParserAutoGen14Private::_data__source_data, &ColladaParserAutoGen14Private::_end__source_data, &ColladaParserAutoGen14Private::_preBegin__source_data, &ColladaParserAutoGen14Private::_preEnd__source_data, &ColladaParserAutoGen14Private::_freeAttributes__source_data);
mapFilled = true;
}
return functionMap;
}